

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlDOMWrapNSNormAcquireNormalizedNs
              (xmlDocPtr doc,xmlNodePtr elem,xmlNsPtr ns,xmlNsPtr *retNs,xmlNsMapPtr *nsMap,
              int depth,int ancestorsOnly,int prefixed)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlNsPtr pxVar3;
  xmlNsMapItemPtr_conflict pxVar4;
  xmlNsMapPtr *ppxVar5;
  
  iVar2 = -1;
  if (nsMap != (xmlNsMapPtr *)0x0 && (retNs != (xmlNsPtr *)0x0 && ns != (xmlNsPtr)0x0)) {
    *retNs = (xmlNsPtr)0x0;
    pxVar1 = ns->prefix;
    if ((((pxVar1 == (xmlChar *)0x0) || (*pxVar1 != 'x')) || (pxVar1[1] != 'm')) ||
       ((pxVar1[2] != 'l' || (pxVar1[3] != '\0')))) {
      ppxVar5 = nsMap;
      if (*nsMap != (xmlNsMapPtr)0x0) {
        for (pxVar4 = (*nsMap)->first; pxVar4 != (xmlNsMapItemPtr_conflict)0x0;
            pxVar4 = pxVar4->next) {
          if ((-2 < pxVar4->depth) && (pxVar4->shadowDepth == -1)) {
            pxVar3 = pxVar4->newNs;
            pxVar1 = pxVar3->href;
            if (((pxVar1 != (xmlChar *)0x0) && (*pxVar1 != '\0')) &&
               ((ancestorsOnly == 0 || (pxVar3->prefix != (xmlChar *)0x0)))) {
              if (pxVar1 != ns->href) {
                iVar2 = xmlStrEqual(pxVar1,ns->href);
                if (iVar2 == 0) goto LAB_0014f11d;
                pxVar3 = pxVar4->newNs;
              }
              pxVar4->oldNs = ns;
              *retNs = pxVar3;
              goto LAB_0014f228;
            }
          }
LAB_0014f11d:
        }
      }
      if (elem == (xmlNodePtr)0x0) {
        pxVar3 = xmlDOMWrapStoreNs(doc,ns->href,ns->prefix);
        if (pxVar3 == (xmlNsPtr)0x0) {
          return -1;
        }
        depth = -3;
      }
      else {
        pxVar3 = xmlDOMWrapNSNormDeclareNsForced
                           ((xmlDocPtr)elem,(xmlNodePtr)ns->href,ns->prefix,(xmlChar *)0x0,
                            (int)ppxVar5);
        if (pxVar3 == (xmlNsPtr)0x0) {
          return -1;
        }
        if (*nsMap != (xmlNsMapPtr)0x0) {
          for (pxVar4 = (*nsMap)->first; pxVar4 != (xmlNsMapItemPtr_conflict)0x0;
              pxVar4 = pxVar4->next) {
            if ((pxVar4->depth < depth) && (pxVar4->shadowDepth == -1)) {
              pxVar1 = pxVar4->newNs->prefix;
              if ((ns->prefix == pxVar1) || (iVar2 = xmlStrEqual(ns->prefix,pxVar1), iVar2 != 0)) {
                pxVar4->shadowDepth = depth;
                break;
              }
            }
          }
        }
      }
      iVar2 = -1;
      pxVar4 = xmlDOMWrapNsMapAddItem(nsMap,-1,ns,pxVar3,depth);
      if (pxVar4 != (xmlNsMapItemPtr_conflict)0x0) {
        *retNs = pxVar3;
LAB_0014f228:
        iVar2 = 0;
      }
    }
    else {
      pxVar3 = doc->oldNs;
      if (pxVar3 == (xmlNsPtr)0x0) {
        pxVar3 = xmlNewXmlNs();
        doc->oldNs = pxVar3;
      }
      *retNs = pxVar3;
      iVar2 = -(uint)(pxVar3 == (xmlNsPtr)0x0);
    }
  }
  return iVar2;
}

Assistant:

static int
xmlDOMWrapNSNormAcquireNormalizedNs(xmlDocPtr doc,
				   xmlNodePtr elem,
				   xmlNsPtr ns,
				   xmlNsPtr *retNs,
				   xmlNsMapPtr *nsMap,

				   int depth,
				   int ancestorsOnly,
				   int prefixed)
{
    xmlNsMapItemPtr mi;

    if ((doc == NULL) || (ns == NULL) || (retNs == NULL) ||
	(nsMap == NULL))
	return (-1);

    *retNs = NULL;
    /*
    * Handle XML namespace.
    */
    if (IS_STR_XML(ns->prefix)) {
	/*
	* Insert XML namespace mapping.
	*/
	*retNs = xmlTreeEnsureXMLDecl(doc);
	if (*retNs == NULL)
	    return (-1);
	return (0);
    }
    /*
    * If the search should be done in ancestors only and no
    * @elem (the first ancestor) was specified, then skip the search.
    */
    if ((XML_NSMAP_NOTEMPTY(*nsMap)) &&
	(! (ancestorsOnly && (elem == NULL))))
    {
	/*
	* Try to find an equal ns-name in in-scope ns-decls.
	*/
	XML_NSMAP_FOREACH(*nsMap, mi) {
	    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
		/*
		* ancestorsOnly: This should be turned on to gain speed,
		* if one knows that the branch itself was already
		* ns-wellformed and no stale references existed.
		* I.e. it searches in the ancestor axis only.
		*/
		((! ancestorsOnly) || (mi->depth == XML_TREE_NSMAP_PARENT)) &&
		/* Skip shadowed prefixes. */
		(mi->shadowDepth == -1) &&
		/* Skip xmlns="" or xmlns:foo="". */
		((mi->newNs->href != NULL) &&
		(mi->newNs->href[0] != 0)) &&
		/* Ensure a prefix if wanted. */
		((! prefixed) || (mi->newNs->prefix != NULL)) &&
		/* Equal ns name */
		((mi->newNs->href == ns->href) ||
		xmlStrEqual(mi->newNs->href, ns->href))) {
		/* Set the mapping. */
		mi->oldNs = ns;
		*retNs = mi->newNs;
		return (0);
	    }
	}
    }
    /*
    * No luck, the namespace is out of scope or shadowed.
    */
    if (elem == NULL) {
	xmlNsPtr tmpns;

	/*
	* Store ns-decls in "oldNs" of the document-node.
	*/
	tmpns = xmlDOMWrapStoreNs(doc, ns->href, ns->prefix);
	if (tmpns == NULL)
	    return (-1);
	/*
	* Insert mapping.
	*/
	if (xmlDOMWrapNsMapAddItem(nsMap, -1, ns,
		tmpns, XML_TREE_NSMAP_DOC) == NULL) {
	    return (-1);
	}
	*retNs = tmpns;
    } else {
	xmlNsPtr tmpns;

	tmpns = xmlDOMWrapNSNormDeclareNsForced(doc, elem, ns->href,
	    ns->prefix, 0);
	if (tmpns == NULL)
	    return (-1);

	if (*nsMap != NULL) {
	    /*
	    * Does it shadow ancestor ns-decls?
	    */
	    XML_NSMAP_FOREACH(*nsMap, mi) {
		if ((mi->depth < depth) &&
		    (mi->shadowDepth == -1) &&
		    ((ns->prefix == mi->newNs->prefix) ||
		    xmlStrEqual(ns->prefix, mi->newNs->prefix))) {
		    /*
		    * Shadows.
		    */
		    mi->shadowDepth = depth;
		    break;
		}
	    }
	}
	if (xmlDOMWrapNsMapAddItem(nsMap, -1, ns, tmpns, depth) == NULL) {
	    return (-1);
	}
	*retNs = tmpns;
    }
    return (0);
}